

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRegexp.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  code *pcVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  xmlRegexpPtr comp;
  undefined8 *puVar6;
  ulong uVar7;
  int iVar8;
  char *pattern;
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  xmlInitMemory();
  if (argc < 2) {
    usage(*argv);
    return 1;
  }
  local_13c0 = (char *)0x0;
  for (iVar8 = 1; pcVar4 = local_13c0, iVar8 < argc; iVar8 = iVar8 + 1) {
    pcVar1 = argv[iVar8];
    if (*pcVar1 == '-') {
      if ((pcVar1[1] == '\0') || ((pcVar1[1] == '-' && (pcVar1[2] == '\0')))) break;
      iVar3 = strcmp(pcVar1,"-debug");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar1,"--debug"), iVar3 == 0)) {
        debug = debug + 1;
      }
      else {
        iVar3 = strcmp(pcVar1,"-repeat");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar1,"--repeat"), iVar3 == 0)) {
          repeat = repeat + 1;
        }
        else if ((((pcVar1[1] == 'i') && (pcVar1[2] == '\0')) ||
                 ((pcVar1[1] == 'f' && (pcVar1[2] == '\0')))) ||
                (iVar3 = strcmp(pcVar1,"--input"), iVar3 == 0)) {
          local_13c0 = argv[(long)iVar8 + 1];
          iVar8 = iVar8 + 1;
        }
        else {
          fprintf(_stderr,"Unknown option %s\n",pcVar1);
          usage(*argv);
        }
      }
    }
  }
  if (local_13c0 != (char *)0x0) {
    __stream = fopen64(local_13c0,"r");
    if (__stream != (FILE *)0x0) {
      comp = (xmlRegexpPtr)0x0;
LAB_001013d0:
      do {
        pcVar4 = fgets(local_13b8,0x1194,__stream);
        if (pcVar4 == (char *)0x0) goto LAB_0010149d;
        sVar5 = strlen(local_13b8);
        pcVar4 = local_13b8 + (int)sVar5;
        for (uVar7 = sVar5 & 0xffffffff; 0 < (int)(uint)uVar7; uVar7 = uVar7 - 1) {
          if ((0x20 < (ulong)(byte)local_13b8[uVar7 - 1]) ||
             ((0x100002600U >> ((ulong)(byte)local_13b8[uVar7 - 1] & 0x3f) & 1) == 0)) {
            local_13b8[(uint)uVar7 & 0x7fffffff] = '\0';
            if (local_13b8[0] == '#') goto LAB_001013d0;
            if ((local_13b8[0] == '=') && (local_13b8[1] == '>')) {
              if (comp != (xmlRegexpPtr)0x0) {
                xmlRegFreeRegexp(comp);
              }
              printf("Regexp: %s\n",local_13b8 + 2);
              pcVar4 = local_13b8 + 2;
            }
            else {
              if (comp != (xmlRegexpPtr)0x0) {
                testRegexp(comp,local_13b8);
                goto LAB_001013d0;
              }
              printf("Regexp: %s\n",local_13b8);
              pcVar4 = local_13b8;
            }
            comp = (xmlRegexpPtr)xmlRegexpCompile(pcVar4);
            if (comp != (xmlRegexpPtr)0x0) goto LAB_001013d0;
            puts("   failed to compile");
            comp = (xmlRegexpPtr)0x0;
            goto LAB_0010149d;
          }
          pcVar4 = pcVar4 + -1;
        }
        *pcVar4 = '\0';
      } while( true );
    }
    puVar6 = (undefined8 *)__xmlGenericError();
    pcVar2 = (code *)*puVar6;
    puVar6 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar2)(*puVar6,"Cannot open %s for reading\n",pcVar4);
    goto LAB_001015b6;
  }
  comp = (xmlRegexpPtr)0x0;
  pcVar4 = (char *)0x0;
  local_13c0 = (char *)0x0;
  for (uVar7 = 1; uVar7 < (uint)argc; uVar7 = uVar7 + 1) {
    pcVar1 = argv[uVar7];
    if (*pcVar1 == '-') {
      if ((pcVar1[1] == '-') && (pcVar1[2] == '\0')) {
        local_13c0 = (char *)CONCAT44(local_13c0._4_4_,1);
      }
      else {
        if ((int)local_13c0 == 1 || pcVar1[1] == '\0') goto LAB_00101506;
        local_13c0 = (char *)((ulong)local_13c0._4_4_ << 0x20);
      }
    }
    else {
LAB_00101506:
      if (pcVar4 == (char *)0x0) {
        printf("Testing %s:\n",pcVar1);
        comp = (xmlRegexpPtr)xmlRegexpCompile(pcVar1);
        if (comp == (xmlRegexpPtr)0x0) {
          puts("   failed to compile");
          goto LAB_001015b6;
        }
        pcVar4 = pcVar1;
        if (debug != 0) {
          xmlRegexpPrint(_stdout,comp);
        }
      }
      else {
        testRegexp(comp,pcVar1);
      }
    }
  }
joined_r0x0010157e:
  if (comp != (xmlRegexpPtr)0x0) {
    xmlRegFreeRegexp(comp);
  }
LAB_001015b6:
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
LAB_0010149d:
  fclose(__stream);
  goto joined_r0x0010157e;
}

Assistant:

int main(int argc, char **argv) {
    xmlRegexpPtr comp = NULL;
#ifdef LIBXML_EXPR_ENABLED
    xmlExpNodePtr expr = NULL;
    int use_exp = 0;
    xmlExpCtxtPtr ctxt = NULL;
#endif
    const char *pattern = NULL;
    char *filename = NULL;
    int i;

    xmlInitMemory();

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    continue;
	if (!strcmp(argv[i], "--"))
	    break;

	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug"))) {
	    debug++;
	} else if ((!strcmp(argv[i], "-repeat")) ||
	         (!strcmp(argv[i], "--repeat"))) {
	    repeat++;
#ifdef LIBXML_EXPR_ENABLED
	} else if ((!strcmp(argv[i], "-expr")) ||
	         (!strcmp(argv[i], "--expr"))) {
	    use_exp++;
#endif
	} else if ((!strcmp(argv[i], "-i")) || (!strcmp(argv[i], "-f")) ||
		   (!strcmp(argv[i], "--input")))
	    filename = argv[++i];
        else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	}
    }

#ifdef LIBXML_EXPR_ENABLED
    if (use_exp)
	ctxt = xmlExpNewCtxt(0, NULL);
#endif

    if (filename != NULL) {
#ifdef LIBXML_EXPR_ENABLED
        if (use_exp)
	    runFileTest(ctxt, filename);
	else
#endif
	    testRegexpFile(filename);
    } else {
        int  data = 0;
#ifdef LIBXML_EXPR_ENABLED

        if (use_exp) {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		    (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing expr %s:\n", pattern);
			expr = xmlExpParse(ctxt, pattern);
			if (expr == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug) {
			    exprDebug(ctxt, expr);
			}
		    } else {
			testReduce(ctxt, expr, argv[i]);
		    }
		}
	    }
	    if (expr != NULL) {
		xmlExpFree(ctxt, expr);
		expr = NULL;
	    }
	} else
#endif
        {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		         (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing %s:\n", pattern);
			comp = xmlRegexpCompile((const xmlChar *) pattern);
			if (comp == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug)
			    xmlRegexpPrint(stdout, comp);
		    } else {
			testRegexp(comp, argv[i]);
		    }
		}
	    }
	    if (comp != NULL)
		xmlRegFreeRegexp(comp);
        }
    }
#ifdef LIBXML_EXPR_ENABLED
    if (ctxt != NULL) {
	printf("Ops: %d nodes, %d cons\n",
	       xmlExpCtxtNbNodes(ctxt), xmlExpCtxtNbCons(ctxt));
	xmlExpFreeCtxt(ctxt);
    }
#endif
    xmlCleanupParser();
    xmlMemoryDump();
    return(0);
}